

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

id_type __thiscall Darts::Details::DawgBuilder::hash_unit(DawgBuilder *this,id_type id)

{
  id_type iVar1;
  id_type hash_value;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  do {
    if (id == 0) {
      return uVar2;
    }
    uVar3 = (ulong)id;
    iVar1 = hash((uint)(byte)(this->labels_).buf_.array_[uVar3] << 0x18 ^
                 *(uint *)((this->units_).buf_.array_ + uVar3 * 4));
    uVar2 = uVar2 ^ iVar1;
    id = id + 1;
  } while (((this->units_).buf_.array_[uVar3 * 4] & 1U) != 0);
  return uVar2;
}

Assistant:

inline id_type DawgBuilder::hash_unit(id_type id) const {
  id_type hash_value = 0;
  for ( ; id != 0; ++id) {
    id_type unit = units_[id].unit();
    uchar_type label = labels_[id];
    hash_value ^= hash((label << 24) ^ unit);

    if (units_[id].has_sibling() == false) {
      break;
    }
  }
  return hash_value;
}